

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrGetFacialExpressionsHTC
                   (XrFacialTrackerHTC facialTracker,XrFacialExpressionsHTC *facialExpressions)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_3e1;
  string local_3e0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3c0;
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_308;
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  GenValidUsageXrInstanceInfo *local_2a0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_facialtrackerhtc_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_278 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  XrFacialTrackerHTC_T local_1f0 [32];
  ostringstream local_1d0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_44;
  undefined1 local_40 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrFacialExpressionsHTC *facialExpressions_local;
  XrFacialTrackerHTC facialTracker_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  facialExpressions_local = (XrFacialExpressionsHTC *)facialTracker;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  local_44 = XR_OBJECT_TYPE_FACIAL_TRACKER_HTC;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrFacialTrackerHTC_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_40
             ,(XrFacialTrackerHTC_T **)&facialExpressions_local,&local_44);
  VVar1 = VerifyXrFacialTrackerHTCHandle((XrFacialTrackerHTC *)&facialExpressions_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrFacialTrackerHTC_T_*>::getWithInstanceInfo
                      (&g_facialtrackerhtc_info,(XrFacialTrackerHTC_T *)facialExpressions_local);
    pGVar2 = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2a0 = pGVar2;
    gen_facialtrackerhtc_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar2;
    if (facialExpressions == (XrFacialExpressionsHTC *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c0,"VUID-xrGetFacialExpressionsHTC-facialExpressions-parameter",&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"xrGetFacialExpressionsHTC",&local_2e9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_308,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_328,
                 "Invalid NULL for XrFacialExpressionsHTC \"facialExpressions\" which is not optional and must be non-NULL"
                 ,&local_329);
      CoreValidLogMessage(pGVar2,(string *)local_2c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2e8,&local_308,(string *)local_328);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_308);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      facialTracker_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_350,"xrGetFacialExpressionsHTC",&local_351);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_350,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_40,false,true,facialExpressions);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      pGVar2 = local_2a0;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        facialTracker_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_378,"VUID-xrGetFacialExpressionsHTC-facialExpressions-parameter",&local_379
                  );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3a0,"xrGetFacialExpressionsHTC",&local_3a1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3c0,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3e0,"Command xrGetFacialExpressionsHTC param facialExpressions is invalid",
                   &local_3e1);
        CoreValidLogMessage(pGVar2,(string *)local_378,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_3a0,&local_3c0,(string *)local_3e0);
        std::__cxx11::string::~string(local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3c0);
        std::__cxx11::string::~string(local_3a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
        std::__cxx11::string::~string(local_378);
        std::allocator<char>::~allocator((allocator<char> *)&local_379);
        facialTracker_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    std::operator<<((ostream *)local_1d0,"Invalid XrFacialTrackerHTC handle \"facialTracker\" ");
    HandleToHexString<XrFacialTrackerHTC_T*>(local_1f0);
    std::operator<<((ostream *)local_1d0,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_210,"VUID-xrGetFacialExpressionsHTC-facialTracker-parameter",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"xrGetFacialExpressionsHTC",&local_239);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_258,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_40);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_210,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_238,&local_258,local_278);
    std::__cxx11::string::~string((string *)local_278);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_258);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    facialTracker_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d0);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  return facialTracker_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrGetFacialExpressionsHTC(
XrFacialTrackerHTC facialTracker,
XrFacialExpressionsHTC* facialExpressions) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(facialTracker, XR_OBJECT_TYPE_FACIAL_TRACKER_HTC);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrFacialTrackerHTCHandle(&facialTracker);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrFacialTrackerHTC handle \"facialTracker\" ";
                oss << HandleToHexString(facialTracker);
                CoreValidLogMessage(nullptr, "VUID-xrGetFacialExpressionsHTC-facialTracker-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionsHTC",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_facialtrackerhtc_info.getWithInstanceInfo(facialTracker);
        GenValidUsageXrHandleInfo *gen_facialtrackerhtc_info = info_with_instance.first;
        (void)gen_facialtrackerhtc_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == facialExpressions) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionsHTC-facialExpressions-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionsHTC", objects_info,
                                "Invalid NULL for XrFacialExpressionsHTC \"facialExpressions\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrFacialExpressionsHTC is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetFacialExpressionsHTC", objects_info,
                                                        false, true, facialExpressions);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionsHTC-facialExpressions-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionsHTC",
                                objects_info,
                                "Command xrGetFacialExpressionsHTC param facialExpressions is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}